

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iidentity16_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i alVar3;
  int local_bc;
  __m128i srcx2;
  __m128i x;
  int i;
  __m128i scale;
  int16_t scale_fractional;
  __m128i *output_local;
  __m128i *input_local;
  
  for (local_bc = 0; local_bc < 0x10; local_bc = local_bc + 1) {
    auVar1._8_8_ = 0x6a106a106a106a10;
    auVar1._0_8_ = 0x6a106a106a106a10;
    auVar1 = pmulhrsw((undefined1  [16])input[local_bc],auVar1);
    auVar2 = paddsw((undefined1  [16])input[local_bc],(undefined1  [16])input[local_bc]);
    alVar3 = (__m128i)paddsw(auVar1,auVar2);
    output[local_bc] = alVar3;
  }
  return;
}

Assistant:

static void iidentity16_ssse3(const __m128i *input, __m128i *output) {
  const int16_t scale_fractional = 2 * (NewSqrt2 - (1 << NewSqrt2Bits));
  const __m128i scale = _mm_set1_epi16(scale_fractional << (15 - NewSqrt2Bits));
  for (int i = 0; i < 16; ++i) {
    __m128i x = _mm_mulhrs_epi16(input[i], scale);
    __m128i srcx2 = _mm_adds_epi16(input[i], input[i]);
    output[i] = _mm_adds_epi16(x, srcx2);
  }
}